

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O3

void __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::wrapexcept
          (wrapexcept<boost::xpressive::regex_error> *this,regex_error *e,source_location *loc)

{
  refcount_ptr<boost::exception_detail::error_info_container> *prVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  error_info_container *peVar4;
  char *pcVar5;
  int iVar6;
  uint_least32_t uVar7;
  error_info_container *peVar8;
  undefined1 auVar9 [16];
  
  (this->super_type)._vptr_clone_base = (_func_int **)&PTR___cxa_pure_virtual_00193368;
  std::runtime_error::runtime_error
            (&(this->super_regex_error).super_runtime_error,&e->super_runtime_error);
  (this->super_regex_error).super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_001933e0;
  prVar1 = &(this->super_regex_error).super_exception.data_;
  peVar8 = (e->super_exception).data_.px_;
  (this->super_regex_error).super_exception.data_.px_ = peVar8;
  if (peVar8 == (error_info_container *)0x0) {
    peVar8 = (error_info_container *)0x0;
  }
  else {
    (**(code **)(*(long *)peVar8 + 0x18))();
    peVar8 = prVar1->px_;
  }
  iVar6 = (e->super_exception).throw_column_;
  (this->super_regex_error).super_exception.throw_line_ = (e->super_exception).throw_line_;
  (this->super_regex_error).super_exception.throw_column_ = iVar6;
  pcVar5 = (e->super_exception).throw_file_;
  (this->super_regex_error).super_exception.throw_function_ = (e->super_exception).throw_function_;
  (this->super_regex_error).super_exception.throw_file_ = pcVar5;
  (this->super_regex_error).code_ = e->code_;
  (this->super_type)._vptr_clone_base = (_func_int **)&PTR_clone_001932f0;
  *(undefined ***)&this->super_regex_error = &PTR__wrapexcept_00193320;
  (this->super_regex_error).super_exception._vptr_exception =
       (_func_int **)&PTR__wrapexcept_00193348;
  peVar4 = (e->super_exception).data_.px_;
  if (peVar8 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar8 + 0x20))();
  }
  prVar1->px_ = peVar4;
  if (peVar4 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar4 + 0x18))(peVar4);
  }
  iVar6 = (e->super_exception).throw_column_;
  (this->super_regex_error).super_exception.throw_line_ = (e->super_exception).throw_line_;
  (this->super_regex_error).super_exception.throw_column_ = iVar6;
  pcVar5 = (e->super_exception).throw_file_;
  (this->super_regex_error).super_exception.throw_function_ = (e->super_exception).throw_function_;
  (this->super_regex_error).super_exception.throw_file_ = pcVar5;
  uVar2 = loc->file_;
  uVar3 = loc->function_;
  auVar9._8_4_ = (int)uVar2;
  auVar9._0_8_ = uVar3;
  auVar9._12_4_ = (int)((ulong)uVar2 >> 0x20);
  (this->super_regex_error).super_exception.throw_function_ = (char *)uVar3;
  (this->super_regex_error).super_exception.throw_file_ = (char *)auVar9._8_8_;
  uVar7 = loc->column_;
  (this->super_regex_error).super_exception.throw_line_ = loc->line_;
  (this->super_regex_error).super_exception.throw_column_ = uVar7;
  return;
}

Assistant:

explicit wrapexcept( E const & e, boost::source_location const & loc ): E( e )
    {
        copy_from( &e );

        set_info( *this, throw_file( loc.file_name() ) );
        set_info( *this, throw_line( static_cast<int>( loc.line() ) ) );
        set_info( *this, throw_function( loc.function_name() ) );
        set_info( *this, throw_column( static_cast<int>( loc.column() ) ) );
    }